

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Bitmask exprSelectUsage(WhereMaskSet *pMaskSet,Select *pS)

{
  ExprList *pEVar1;
  SrcList *pSVar2;
  Expr *p;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  Bitmask BVar6;
  ushort uVar7;
  int iVar8;
  ulong uVar9;
  Bitmask BVar10;
  ExprList_item *pEVar11;
  long lVar12;
  long lVar13;
  
  if (pS == (Select *)0x0) {
    BVar10 = 0;
  }
  else {
    BVar10 = 0;
    do {
      pEVar1 = pS->pEList;
      pSVar2 = pS->pSrc;
      if ((pEVar1 == (ExprList *)0x0) || (iVar8 = pEVar1->nExpr, iVar8 < 1)) {
        uVar9 = 0;
      }
      else {
        pEVar11 = pEVar1->a;
        lVar13 = 0;
        uVar9 = 0;
        do {
          if (pEVar11->pExpr == (Expr *)0x0) {
            uVar3 = 0;
          }
          else {
            uVar3 = sqlite3WhereExprUsageNN(pMaskSet,pEVar11->pExpr);
            iVar8 = pEVar1->nExpr;
          }
          uVar9 = uVar9 | uVar3;
          lVar13 = lVar13 + 1;
          pEVar11 = pEVar11 + 1;
        } while (lVar13 < iVar8);
      }
      pEVar1 = pS->pGroupBy;
      if ((pEVar1 == (ExprList *)0x0) || (iVar8 = pEVar1->nExpr, iVar8 < 1)) {
        uVar3 = 0;
      }
      else {
        pEVar11 = pEVar1->a;
        lVar13 = 0;
        uVar3 = 0;
        do {
          if (pEVar11->pExpr == (Expr *)0x0) {
            uVar4 = 0;
          }
          else {
            uVar4 = sqlite3WhereExprUsageNN(pMaskSet,pEVar11->pExpr);
            iVar8 = pEVar1->nExpr;
          }
          uVar3 = uVar3 | uVar4;
          lVar13 = lVar13 + 1;
          pEVar11 = pEVar11 + 1;
        } while (lVar13 < iVar8);
      }
      pEVar1 = pS->pOrderBy;
      if ((pEVar1 == (ExprList *)0x0) || (iVar8 = pEVar1->nExpr, iVar8 < 1)) {
        uVar4 = 0;
      }
      else {
        pEVar11 = pEVar1->a;
        lVar13 = 0;
        uVar4 = 0;
        do {
          if (pEVar11->pExpr == (Expr *)0x0) {
            uVar5 = 0;
          }
          else {
            uVar5 = sqlite3WhereExprUsageNN(pMaskSet,pEVar11->pExpr);
            iVar8 = pEVar1->nExpr;
          }
          uVar4 = uVar4 | uVar5;
          lVar13 = lVar13 + 1;
          pEVar11 = pEVar11 + 1;
        } while (lVar13 < iVar8);
      }
      if (pS->pWhere == (Expr *)0x0) {
        BVar6 = 0;
      }
      else {
        BVar6 = sqlite3WhereExprUsageNN(pMaskSet,pS->pWhere);
      }
      if (pS->pHaving == (Expr *)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = sqlite3WhereExprUsageNN(pMaskSet,pS->pHaving);
      }
      BVar10 = uVar9 | BVar10 | uVar3 | uVar4 | BVar6 | uVar5;
      if ((pSVar2 != (SrcList *)0x0) && (0 < pSVar2->nSrc)) {
        lVar13 = 0;
        do {
          BVar6 = exprSelectUsage(pMaskSet,pSVar2->a[lVar13].pSelect);
          BVar10 = BVar6 | BVar10;
          uVar7 = *(ushort *)&pSVar2->a[lVar13].fg.field_0x1;
          if ((uVar7 >> 10 & 1) == 0) {
            p = pSVar2->a[lVar13].u3.pOn;
            if (p == (Expr *)0x0) {
              uVar9 = 0;
            }
            else {
              uVar9 = sqlite3WhereExprUsageNN(pMaskSet,p);
              uVar7 = *(ushort *)&pSVar2->a[lVar13].fg.field_0x1;
            }
            BVar10 = BVar10 | uVar9;
          }
          if ((uVar7 & 4) != 0) {
            pEVar1 = pSVar2->a[lVar13].u1.pFuncArg;
            if ((pEVar1 == (ExprList *)0x0) || (iVar8 = pEVar1->nExpr, iVar8 < 1)) {
              uVar9 = 0;
            }
            else {
              pEVar11 = pEVar1->a;
              lVar12 = 0;
              uVar9 = 0;
              do {
                if (pEVar11->pExpr == (Expr *)0x0) {
                  uVar3 = 0;
                }
                else {
                  uVar3 = sqlite3WhereExprUsageNN(pMaskSet,pEVar11->pExpr);
                  iVar8 = pEVar1->nExpr;
                }
                uVar9 = uVar9 | uVar3;
                lVar12 = lVar12 + 1;
                pEVar11 = pEVar11 + 1;
              } while (lVar12 < iVar8);
            }
            BVar10 = BVar10 | uVar9;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < pSVar2->nSrc);
      }
      pS = pS->pPrior;
    } while (pS != (Select *)0x0);
  }
  return BVar10;
}

Assistant:

static Bitmask exprSelectUsage(WhereMaskSet *pMaskSet, Select *pS){
  Bitmask mask = 0;
  while( pS ){
    SrcList *pSrc = pS->pSrc;
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pEList);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pGroupBy);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pOrderBy);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pWhere);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pHaving);
    if( ALWAYS(pSrc!=0) ){
      int i;
      for(i=0; i<pSrc->nSrc; i++){
        mask |= exprSelectUsage(pMaskSet, pSrc->a[i].pSelect);
        if( pSrc->a[i].fg.isUsing==0 ){
          mask |= sqlite3WhereExprUsage(pMaskSet, pSrc->a[i].u3.pOn);
        }
        if( pSrc->a[i].fg.isTabFunc ){
          mask |= sqlite3WhereExprListUsage(pMaskSet, pSrc->a[i].u1.pFuncArg);
        }
      }
    }
    pS = pS->pPrior;
  }
  return mask;
}